

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::TagSet::add(TagSet *this,Tag *tag)

{
  string local_a0;
  string local_80;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::Tag>
  local_60;
  
  std::__cxx11::string::string((string *)&local_80,(string *)tag);
  toLower(&local_a0,&local_80);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::Tag>
  ::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (&local_60,&local_a0,tag);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,Catch::Tag>,std::_Select1st<std::pair<std::__cxx11::string_const,Catch::Tag>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Catch::Tag>>>
  ::_M_emplace_unique<std::pair<std::__cxx11::string,Catch::Tag>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,Catch::Tag>,std::_Select1st<std::pair<std::__cxx11::string_const,Catch::Tag>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Catch::Tag>>>
              *)this,&local_60);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::Tag>
  ::~pair(&local_60);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_80);
  return;
}

Assistant:

void add( Tag const& tag ) {
            m_tags.insert( std::make_pair( toLower( tag.getName() ), tag ) );
        }